

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datagram_socket.cpp
# Opt level: O2

int __thiscall sockpp::datagram_socket::open(datagram_socket *this,char *__file,int __oflag,...)

{
  ushort uVar1;
  result<int> createRes;
  result<int> local_48;
  undefined1 local_30 [24];
  
  uVar1 = (**(code **)(*(long *)___oflag + 0x28))(___oflag);
  create_handle(&local_48,(uint)uVar1,0);
  if (local_48.err_._M_value == 0) {
    socket::reset((socket *)__file,local_48.val_);
    socket::bind((socket *)this,(int)__file,___oflag,0);
    if (*(int *)(this + 8) == 0) {
      std::error_code::error_code((error_code *)(this + 8));
    }
    else {
      (**(code **)(*(long *)__file + 0x28))(local_30,__file);
    }
  }
  else {
    *(ulong *)(this + 8) = CONCAT44(local_48.err_._4_4_,local_48.err_._M_value);
    *(error_category **)(this + 0x10) = local_48.err_._M_cat;
  }
  return (int)this;
}

Assistant:

result<> datagram_socket::open(const sock_address& addr) noexcept {
    auto domain = addr.family();
    if (auto createRes = create_handle(domain); !createRes) {
        return createRes.error();
    }
    else {
        reset(createRes.value());
        if (auto res = bind(addr); !res) {
            close();
            return res;
        }
    }
    return none{};
}